

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_error_or.cpp
# Opt level: O0

void __thiscall ErrorOrN_Bind_Test::TestBody(ErrorOrN_Bind_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference lhs;
  char *in_R9;
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 local_51;
  undefined1 local_50 [8];
  error_or<int> y;
  undefined4 local_30 [2];
  undefined1 local_28 [8];
  error_or_n<int,_int,_int> eo;
  ErrorOrN_Bind_Test *this_local;
  
  local_30[0] = 3;
  y._20_4_ = 5;
  y.has_error_ = true;
  y._17_3_ = 0;
  eo._16_8_ = this;
  pstore::error_or<std::tuple<int,int,int>>::error_or<int,int,int>
            ((error_or<std::tuple<int,int,int>> *)local_28,local_30,&y.field_0x14,&y.has_error_);
  pstore::operator>>=((error_or<int> *)local_50,(error_or_n<int,_int,_int> *)local_28,&local_51);
  testing::AssertionResult::AssertionResult<pstore::error_or<int>>
            ((AssertionResult *)local_78,(error_or<int> *)local_50,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_78,(AssertionResult *)0x2b386e,"false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_error_or.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  lhs = pstore::error_or<int>::operator*((error_or<int> *)local_50);
  local_bc = 0xf;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b8,"*y","15",lhs,&local_bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_error_or.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  pstore::error_or<int>::~error_or((error_or<int> *)local_50);
  pstore::error_or<std::tuple<int,_int,_int>_>::~error_or
            ((error_or<std::tuple<int,_int,_int>_> *)local_28);
  return;
}

Assistant:

TEST (ErrorOrN, Bind) {
    pstore::error_or_n<int, int, int> eo{pstore::in_place, 3, 5, 7};
    pstore::error_or<int> y = eo >>= [] (int a, int b, int c) {
        return pstore::error_or<int>{pstore::in_place, a + b + c};
    };
    EXPECT_TRUE (y);
    EXPECT_EQ (*y, 15);
}